

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# word_split.cpp
# Opt level: O0

void __thiscall
WordSplitSVTest_single_word_trailing_delim_Test<char32_t>::
~WordSplitSVTest_single_word_trailing_delim_Test
          (WordSplitSVTest_single_word_trailing_delim_Test<char32_t> *this)

{
  WordSplitSVTest_single_word_trailing_delim_Test<char32_t> *this_local;
  
  ~WordSplitSVTest_single_word_trailing_delim_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TYPED_TEST(WordSplitSVTest, single_word_trailing_delim) {
	auto word = make_word<TypeParam>();
	word += default_delim<TypeParam>;
	std::basic_string_view<TypeParam> single_word = word;
	std::vector<std::basic_string<TypeParam>> split_result = word_split(single_word, default_delim<TypeParam>);
	EXPECT_EQ(split_result.size(), 1);
	EXPECT_EQ(split_result[0].size(), 8);
}